

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

void inven_drop(object *obj,wchar_t amt)

{
  long lVar1;
  long *plVar2;
  loc grid;
  _Bool _Var3;
  char cVar4;
  uint16_t uVar5;
  uint uVar6;
  object *obj_00;
  long lVar7;
  long lVar8;
  char *fmt;
  player *p;
  _Bool none_left;
  char local_9a;
  char local_99;
  object *first;
  object *dropped;
  char name [80];
  
  none_left = false;
  if ((L'\0' < amt) && (_Var3 = object_is_carried(player,obj), _Var3)) {
    local_9a = gear_to_label(player,obj);
    p = player;
    local_99 = object_is_in_quiver(player,obj);
    if ((uint)obj->number < (uint)amt) {
      amt = (uint)obj->number;
    }
    lVar8 = (ulong)(p->body).count * 0x20 + 0x20;
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 0x20;
      if (lVar8 == lVar1) goto LAB_0018e4b3;
      plVar2 = (long *)((long)&((p->body).slots)->obj + lVar7);
      lVar7 = lVar1;
    } while ((object *)*plVar2 != obj);
    inven_takeoff(obj);
    p = player;
LAB_0018e4b3:
    obj_00 = gear_object_for_use(p,obj,amt,false,&none_left);
    dropped = obj_00;
    object_desc(name,0x50,obj_00,0x43,player);
    uVar6 = (uint)local_9a;
    msg("You drop %s (%c).",name,(ulong)uVar6);
    if (obj_00->artifact == (artifact *)0x0) {
      if ((((lVar8 != lVar1) || (_Var3 = tval_can_have_charges(obj), _Var3)) ||
          (_Var3 = tval_is_rod(obj), _Var3)) || (0 < obj->timeout)) {
        first = (object *)0x0;
        if (none_left == false) {
          uVar5 = (uint16_t)obj->number;
          obj_00 = obj;
        }
        else {
          uVar5 = 0;
        }
      }
      else {
        uVar5 = object_pack_total(player,obj,false,&first);
        if (uVar5 != 0) {
          obj_00 = obj;
        }
      }
      object_desc(name,0x50,obj_00,(uint)uVar5 << 0x10 | 0x443,player);
      if (first == (object *)0x0) {
        fmt = "You have %s (%c).";
      }
      else {
        cVar4 = gear_to_label(player,first);
        uVar6 = (uint)cVar4;
        if (first->number < uVar5) {
          fmt = "You have %s (1st %c).";
        }
        else {
          fmt = "You have %s (%c).";
        }
      }
      msg(fmt,name,(ulong)uVar6);
    }
    else {
      object_desc(name,0x50,obj_00,0x13,player);
      msg("You no longer have the %s (%c).",name,(ulong)uVar6);
    }
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&dropped,L'\0',grid,false,true);
    if (local_99 != '\0') {
      sound(0x81);
    }
    event_signal(EVENT_INVENTORY);
    event_signal(EVENT_EQUIPMENT);
  }
  return;
}

Assistant:

void inven_drop(struct object *obj, int amt)
{
	struct object *dropped;
	bool none_left = false;
	bool equipped = false;
	bool quiver;

	char name[80];
	char label;

	/* Error check */
	if (amt <= 0)
		return;

	/* Check it is still held, in case there were two drop commands queued
	 * for this item.  This is in theory not ideal, but in practice should
	 * be safe. */
	if (!object_is_carried(player, obj))
		return;

	/* Get where the object is now */
	label = gear_to_label(player, obj);

	/* Is it in the quiver? */
	quiver = object_is_in_quiver(player, obj);

	/* Not too many */
	if (amt > obj->number) amt = obj->number;

	/* Take off equipment, don't combine */
	if (object_is_equipped(player->body, obj)) {
		equipped = true;
		inven_takeoff(obj);
	}

	/* Get the object */
	dropped = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Describe the dropped object */
	object_desc(name, sizeof(name), dropped, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	msg("You drop %s (%c).", name, label);

	/* Describe what's left */
	if (dropped->artifact) {
		object_desc(name, sizeof(name), dropped,
			ODESC_FULL | ODESC_SINGULAR, player);
		msg("You no longer have the %s (%c).", name, label);
	} else {
		struct object *first;
		struct object *desc_target;
		uint16_t total;

		/*
		 * Like gear_object_for_use(), don't show an aggregate total
		 * if it was equipped or the item has charges/recharging
		 * notice that is specific to the stack.
		 */
		if (equipped || tval_can_have_charges(obj) || tval_is_rod(obj)
				|| obj->timeout > 0) {
			first = NULL;
			if (none_left) {
				total = 0;
				desc_target = dropped;
			} else {
				total = obj->number;
				desc_target = obj;
			}
		} else {
			total = object_pack_total(player, obj, false, &first);
			desc_target = (total) ? obj : dropped;
		}

		object_desc(name, sizeof(name), desc_target,
			ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
			(total << 16), player);
		if (!first) {
			msg("You have %s (%c).", name, label);
		} else {
			label = gear_to_label(player, first);
			if (total > first->number) {
				msg("You have %s (1st %c).", name, label);
			} else {
				msg("You have %s (%c).", name, label);
			}
		}
	}

	/* Drop it near the player */
	drop_near(cave, &dropped, 0, player->grid, false, true);

	/* Sound for quiver objects */
	if (quiver)
		sound(MSG_QUIVER);

	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}